

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateTensorMessage
                   (Result *__return_storage_ptr__,Tensor *tensor,NeuralNetworkLayer *layer)

{
  uint32 uVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined4 local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint32 local_44;
  undefined1 local_40 [4];
  int rank;
  string err;
  NeuralNetworkLayer *layer_local;
  Tensor *tensor_local;
  
  err.field_2._8_8_ = layer;
  std::__cxx11::string::string((string *)local_40);
  local_44 = Specification::Tensor::rank(tensor);
  iVar2 = Specification::Tensor::dimvalue_size(tensor);
  uVar1 = local_44;
  if (0 < iVar2) {
    uVar3 = Specification::Tensor::dimvalue_size(tensor);
    if (uVar1 != uVar3) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)err.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_b8,(string *)psVar4);
      std::operator+(&local_98,"Tensor in layer \'",&local_b8);
      std::operator+(&local_78,&local_98,"\': rank must match the length of dimValue");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
      goto LAB_009a614a;
    }
    if ((int)local_44 < 1) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)err.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_120,(string *)psVar4);
      std::operator+(&local_100,"Tensor in layer \'",&local_120);
      std::operator+(&local_e0,&local_100,"\': rank must be positive");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
      goto LAB_009a614a;
    }
  }
  Result::Result(__return_storage_ptr__);
LAB_009a614a:
  local_bc = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateTensorMessage(const Specification::Tensor& tensor, const Specification::NeuralNetworkLayer& layer) {
    std::string err;
    int rank = static_cast<int>(tensor.rank());
    if (tensor.dimvalue_size() > 0) {
        if (rank != tensor.dimvalue_size()) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must match the length of dimValue";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (rank < 1) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must be positive";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}